

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlSaveFile(void)

{
  int iVar1;
  int iVar2;
  char *val;
  xmlDocPtr val_00;
  int local_34;
  int n_cur;
  xmlDocPtr cur;
  int n_filename;
  char *filename;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (cur._4_4_ = 0; (int)cur._4_4_ < 6; cur._4_4_ = cur._4_4_ + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_fileoutput(cur._4_4_,0);
      val_00 = gen_xmlDocPtr(local_34,1);
      iVar2 = htmlSaveFile(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_fileoutput(cur._4_4_,val,0);
      des_xmlDocPtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlSaveFile",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)cur._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_htmlSaveFile(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED) && defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    int ret_val;
    const char * filename; /* the filename (or URL) */
    int n_filename;
    xmlDocPtr cur; /* the document */
    int n_cur;

    for (n_filename = 0;n_filename < gen_nb_fileoutput;n_filename++) {
    for (n_cur = 0;n_cur < gen_nb_xmlDocPtr;n_cur++) {
        mem_base = xmlMemBlocks();
        filename = gen_fileoutput(n_filename, 0);
        cur = gen_xmlDocPtr(n_cur, 1);

        ret_val = htmlSaveFile(filename, cur);
        desret_int(ret_val);
        call_tests++;
        des_fileoutput(n_filename, filename, 0);
        des_xmlDocPtr(n_cur, cur, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlSaveFile",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_filename);
            printf(" %d", n_cur);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}